

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::return_function(Simulator *this,PCode *code)

{
  int iVar1;
  int iVar2;
  Symbol *this_00;
  int *pos;
  ScopeNode *pSVar3;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  PCode *local_18;
  PCode *code_local;
  Simulator *this_local;
  
  local_18 = code;
  code_local = (PCode *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"__ret__",&local_39);
  this_00 = ScopeTree::resolve(&this->tree_,&local_38);
  pos = Symbol::int_value(this_00);
  set_eip(this,pos);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  while( true ) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"__ret__",&local_71);
    pSVar3 = ScopeTree::resolve_scope(&this->tree_,&local_70);
    iVar1 = ScopeNode::level(pSVar3);
    pSVar3 = ScopeTree::current(&this->tree_);
    iVar2 = ScopeNode::level(pSVar3);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    if (iVar1 == iVar2) break;
    ScopeTree::pop(&this->tree_);
  }
  ScopeTree::pop(&this->tree_);
  return;
}

Assistant:

void Simulator::return_function(const PCode &code) {
    set_eip(tree_.resolve("__ret__").int_value());
    while (tree_.resolve_scope("__ret__")->level() != tree_.current()->level()) {
        tree_.pop();
    }
    tree_.pop();
}